

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::floorMesh(Mesh *__return_storage_ptr__,float _area,int _subD,float _y)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint32_t _i;
  int x;
  int iVar6;
  uint32_t _i_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar7;
  int local_90;
  uint32_t local_8c;
  vec4 local_88;
  ulong local_70;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_64;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_60;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  
  local_64.y = _y;
  dVar1 = ldexp(1.0,_subD);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = dVar1;
  local_58._12_4_ = extraout_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  local_48 = (float)(int)(double)local_58._0_8_;
  fStack_44 = (float)(int)(double)local_58._8_8_;
  uStack_40 = 0;
  fVar7 = _area / local_48;
  iVar5 = (int)dVar1 + 1;
  local_70 = (ulong)(uint)(int)dVar1;
  for (iVar3 = 0; auVar2 = local_58, iVar3 <= (int)local_70; iVar3 = iVar3 + 1) {
    local_5c.z = (float)iVar3 * fVar7 + _area * -0.5;
    local_60.y = (float)iVar3 / local_48;
    for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
      local_58._0_4_ = (float)iVar6;
      local_88.field_1.y = local_64.y;
      local_88.field_0.x = (float)iVar6 * fVar7 + _area * -0.5;
      local_88.field_2.z = local_5c.z;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_88);
      local_88.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3e808312;
      local_88.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3e808312;
      local_88.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3e808312;
      local_88.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
      Mesh::addColor(__return_storage_ptr__,&local_88);
      local_88.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      local_88.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
      local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_88);
      local_88.field_1 = local_60;
      local_88.field_0.x = (float)local_58._0_4_ / local_48;
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_88);
    }
  }
  local_8c = 0;
  iVar3 = 0;
  if (0 < (int)local_70) {
    iVar3 = (int)local_70;
  }
  _local_48 = CONCAT44(fStack_44,iVar3);
  local_58._4_4_ = 0;
  local_58._0_4_ = (int)local_70 + 2;
  local_58._8_8_ = auVar2._8_8_;
  local_90 = 0;
  while ((float)local_90 != local_48) {
    local_90 = local_90 + 1;
    uVar4 = local_70 & 0xffffffff;
    _i = local_8c;
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      Mesh::addIndex(__return_storage_ptr__,_i);
      Mesh::addIndex(__return_storage_ptr__,_i + 1);
      _i_00 = local_58._0_4_ + _i;
      Mesh::addIndex(__return_storage_ptr__,_i_00);
      Mesh::addIndex(__return_storage_ptr__,_i_00);
      Mesh::addIndex(__return_storage_ptr__,_i + iVar5);
      Mesh::addIndex(__return_storage_ptr__,_i);
      _i = _i + 1;
    }
    local_8c = local_8c + iVar5;
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh floorMesh(float _area, int _subD, float _y) {

    int N = pow(2,_subD);

    Mesh mesh;
    float w = _area/float(N);
    float h = _area/2.0;
    for (int z = 0; z <= N; z++){
        for (int x = 0; x <= N; x++){
            mesh.addVertex(glm::vec3(x * w - h, _y, z * w - h));
            mesh.addColor(glm::vec4(0.251, 0.251, 0.251, 1.0));
            mesh.addNormal(glm::vec3(0.0, 1.0, 0.0));
            mesh.addTexCoord(glm::vec2(float(x)/float(N), float(z)/float(N)));
        }
    }
    
    //
    // 0 -- 1 -- 2      A -- B
    // |    |    |      |    | 
    // 3 -- 4 -- 5      C -- D
    // |    |    |
    // 6 -- 7 -- 8
    //
    for (int y = 0; y < N; y++){
        for (int x=0; x < N; x++){
            mesh.addIndex(  x   +   y   * (N+1));   // A
            mesh.addIndex((x+1) +   y   * (N+1));   // B
            mesh.addIndex((x+1) + (y+1) * (N+1));   // D

            mesh.addIndex((x+1) + (y+1) * (N+1));   // D
            mesh.addIndex(  x   + (y+1) * (N+1));   // C
            mesh.addIndex(  x   +   y   * (N+1));   // A
        }
    }
    mesh.computeTangents();

    return mesh;
}